

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool msr_banked_access_decode
                (DisasContext_conflict1 *s,int r,int sysm,int rn,int *tgtmode,int *regno)

{
  ulong uVar1;
  uint uVar2;
  uint32_t target_el;
  
  if ((s->mmu_idx == ARMMMUIdx_SE10_0) && (s->secure_routed_to_el3 != false)) {
    target_el = 3;
  }
  else {
    target_el = 1;
    if (1 < s->current_el) {
      target_el = s->current_el;
    }
  }
  uVar1 = s->features;
  if ((((uVar1 & 0x108000000) == 0) || (rn == 0xf)) || (s->user != 0))
  goto switchD_005f4167_caseD_7;
  if (r != 0) {
    uVar2 = sysm - 0xe;
    if ((0x10 < uVar2) || ((0x14155U >> (uVar2 & 0x1f) & 1) == 0)) goto switchD_005f4167_caseD_7;
    *tgtmode = *(int *)(&DAT_00b83b48 + (ulong)uVar2 * 4);
    sysm = 0x10;
    goto LAB_005f41c3;
  }
  switch(sysm) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
    *tgtmode = 0x10;
    sysm = sysm + 8;
    goto LAB_005f41c3;
  default:
    goto switchD_005f4167_caseD_7;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    *tgtmode = 0x11;
    goto LAB_005f41c3;
  case 0x10:
  case 0x11:
    *tgtmode = 0x12;
    break;
  case 0x12:
  case 0x13:
    *tgtmode = 0x13;
    break;
  case 0x14:
  case 0x15:
    *tgtmode = 0x17;
    break;
  case 0x16:
  case 0x17:
    *tgtmode = 0x1b;
    break;
  case 0x1c:
  case 0x1d:
    *tgtmode = 0x16;
    break;
  case 0x1e:
  case 0x1f:
    *tgtmode = 0x1a;
    sysm = (uint)((sysm & 1U) == 0) * 4 + 0xd;
    goto LAB_005f41c3;
  }
  sysm = 0xe - (sysm & 1U);
LAB_005f41c3:
  *regno = sysm;
  if (*tgtmode == 0x1a) {
    if (((uVar1 & 0x100000000) != 0) && (1 < s->current_el)) {
      if (s->current_el != 2) {
        return true;
      }
      if (sysm == 0x11) {
        return true;
      }
    }
  }
  else {
    if (*tgtmode != 0x16) {
      return true;
    }
    if (((uVar1 >> 0x21 & 1) != 0) && (s->ns == false)) {
      if (s->current_el != 1) {
        return true;
      }
      target_el = 3;
    }
  }
switchD_005f4167_caseD_7:
  gen_exception_insn(s,(uint32_t)s->pc_curr,1,0x2000000,target_el);
  return false;
}

Assistant:

static bool msr_banked_access_decode(DisasContext *s, int r, int sysm, int rn,
                                     int *tgtmode, int *regno)
{
    /* Decode the r and sysm fields of MSR/MRS banked accesses into
     * the target mode and register number, and identify the various
     * unpredictable cases.
     * MSR (banked) and MRS (banked) are CONSTRAINED UNPREDICTABLE if:
     *  + executed in user mode
     *  + using R15 as the src/dest register
     *  + accessing an unimplemented register
     *  + accessing a register that's inaccessible at current PL/security state*
     *  + accessing a register that you could access with a different insn
     * We choose to UNDEF in all these cases.
     * Since we don't know which of the various AArch32 modes we are in
     * we have to defer some checks to runtime.
     * Accesses to Monitor mode registers from Secure EL1 (which implies
     * that EL3 is AArch64) must trap to EL3.
     *
     * If the access checks fail this function will emit code to take
     * an exception and return false. Otherwise it will return true,
     * and set *tgtmode and *regno appropriately.
     */
    int exc_target = default_exception_el(s);

    /* These instructions are present only in ARMv8, or in ARMv7 with the
     * Virtualization Extensions.
     */
    if (!arm_dc_feature(s, ARM_FEATURE_V8) &&
        !arm_dc_feature(s, ARM_FEATURE_EL2)) {
        goto undef;
    }

    if (IS_USER(s) || rn == 15) {
        goto undef;
    }

    /* The table in the v8 ARM ARM section F5.2.3 describes the encoding
     * of registers into (r, sysm).
     */
    if (r) {
        /* SPSRs for other modes */
        switch (sysm) {
        case 0xe: /* SPSR_fiq */
            *tgtmode = ARM_CPU_MODE_FIQ;
            break;
        case 0x10: /* SPSR_irq */
            *tgtmode = ARM_CPU_MODE_IRQ;
            break;
        case 0x12: /* SPSR_svc */
            *tgtmode = ARM_CPU_MODE_SVC;
            break;
        case 0x14: /* SPSR_abt */
            *tgtmode = ARM_CPU_MODE_ABT;
            break;
        case 0x16: /* SPSR_und */
            *tgtmode = ARM_CPU_MODE_UND;
            break;
        case 0x1c: /* SPSR_mon */
            *tgtmode = ARM_CPU_MODE_MON;
            break;
        case 0x1e: /* SPSR_hyp */
            *tgtmode = ARM_CPU_MODE_HYP;
            break;
        default: /* unallocated */
            goto undef;
        }
        /* We arbitrarily assign SPSR a register number of 16. */
        *regno = 16;
    } else {
        /* general purpose registers for other modes */
        switch (sysm) {
        case 0x0:   /* 0b00xxx : r8_usr ... r14_usr */
        case 0x1:   /* 0b00xxx : r8_usr ... r14_usr */
        case 0x2:   /* 0b00xxx : r8_usr ... r14_usr */
        case 0x3:   /* 0b00xxx : r8_usr ... r14_usr */
        case 0x4:   /* 0b00xxx : r8_usr ... r14_usr */
        case 0x5:   /* 0b00xxx : r8_usr ... r14_usr */
        case 0x6:   /* 0b00xxx : r8_usr ... r14_usr */
            *tgtmode = ARM_CPU_MODE_USR;
            *regno = sysm + 8;
            break;
        case 0x8:   /* 0b01xxx : r8_fiq ... r14_fiq */
        case 0x9:   /* 0b01xxx : r8_fiq ... r14_fiq */
        case 0xa:   /* 0b01xxx : r8_fiq ... r14_fiq */
        case 0xb:   /* 0b01xxx : r8_fiq ... r14_fiq */
        case 0xc:   /* 0b01xxx : r8_fiq ... r14_fiq */
        case 0xd:   /* 0b01xxx : r8_fiq ... r14_fiq */
        case 0xe:   /* 0b01xxx : r8_fiq ... r14_fiq */
            *tgtmode = ARM_CPU_MODE_FIQ;
            *regno = sysm;
            break;
        case 0x10: /* 0b1000x : r14_irq, r13_irq */
        case 0x11: /* 0b1000x : r14_irq, r13_irq */
            *tgtmode = ARM_CPU_MODE_IRQ;
            *regno = sysm & 1 ? 13 : 14;
            break;
        case 0x12: /* 0b1001x : r14_svc, r13_svc */
        case 0x13: /* 0b1001x : r14_svc, r13_svc */
            *tgtmode = ARM_CPU_MODE_SVC;
            *regno = sysm & 1 ? 13 : 14;
            break;
        case 0x14: /* 0b1010x : r14_abt, r13_abt */
        case 0x15: /* 0b1010x : r14_abt, r13_abt */
            *tgtmode = ARM_CPU_MODE_ABT;
            *regno = sysm & 1 ? 13 : 14;
            break;
        case 0x16: /* 0b1011x : r14_und, r13_und */
        case 0x17: /* 0b1011x : r14_und, r13_und */
            *tgtmode = ARM_CPU_MODE_UND;
            *regno = sysm & 1 ? 13 : 14;
            break;
        case 0x1c: /* 0b1110x : r14_mon, r13_mon */
        case 0x1d: /* 0b1110x : r14_mon, r13_mon */
            *tgtmode = ARM_CPU_MODE_MON;
            *regno = sysm & 1 ? 13 : 14;
            break;
        case 0x1e: /* 0b1111x : elr_hyp, r13_hyp */
        case 0x1f: /* 0b1111x : elr_hyp, r13_hyp */
            *tgtmode = ARM_CPU_MODE_HYP;
            /* Arbitrarily pick 17 for ELR_Hyp (which is not a banked LR!) */
            *regno = sysm & 1 ? 13 : 17;
            break;
        default: /* unallocated */
            goto undef;
        }
    }

    /* Catch the 'accessing inaccessible register' cases we can detect
     * at translate time.
     */
    switch (*tgtmode) {
    case ARM_CPU_MODE_MON:
        if (!arm_dc_feature(s, ARM_FEATURE_EL3) || s->ns) {
            goto undef;
        }
        if (s->current_el == 1) {
            /* If we're in Secure EL1 (which implies that EL3 is AArch64)
             * then accesses to Mon registers trap to EL3
             */
            exc_target = 3;
            goto undef;
        }
        break;
    case ARM_CPU_MODE_HYP:
        /*
         * SPSR_hyp and r13_hyp can only be accessed from Monitor mode
         * (and so we can forbid accesses from EL2 or below). elr_hyp
         * can be accessed also from Hyp mode, so forbid accesses from
         * EL0 or EL1.
         */
        if (!arm_dc_feature(s, ARM_FEATURE_EL2) || s->current_el < 2 ||
            (s->current_el < 3 && *regno != 17)) {
            goto undef;
        }
        break;
    default:
        break;
    }

    return true;

undef:
    /* If we get here then some access check did not pass */
    gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                       syn_uncategorized(), exc_target);
    return false;
}